

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  long lVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  byte bVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar57;
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [32];
  undefined4 uVar63;
  float fVar64;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar65 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  uint uVar77;
  uint uVar79;
  uint uVar80;
  uint uVar81;
  float fVar82;
  float fVar83;
  undefined1 auVar78 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [64];
  undefined1 auVar94 [64];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2724;
  RTCIntersectArguments *local_2720;
  ulong local_2718;
  Geometry *local_2710;
  ulong local_2708;
  ulong local_2700;
  ulong local_26f8;
  ulong local_26f0;
  ulong *local_26e8;
  RayQueryContext *local_26e0;
  ulong local_26d8;
  ulong local_26d0;
  long local_26c8;
  RTCFilterFunctionNArguments local_26c0;
  float local_2690;
  undefined4 local_268c;
  undefined4 local_2688;
  float local_2684;
  float local_2680;
  undefined4 local_267c;
  uint local_2678;
  uint local_2674;
  uint local_2670;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25e0 [32];
  byte local_25bf;
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2398[0] = 0;
    if (local_23a0 != 8) {
      local_26e8 = local_2390;
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar41 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar11 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar38._8_4_ = 0x7fffffff;
      auVar38._0_8_ = 0x7fffffff7fffffff;
      auVar38._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx512vl((undefined1  [16])aVar2,auVar38);
      auVar69._8_4_ = 0x219392ef;
      auVar69._0_8_ = 0x219392ef219392ef;
      auVar69._12_4_ = 0x219392ef;
      uVar34 = vcmpps_avx512vl(auVar38,auVar69,1);
      bVar10 = (bool)((byte)uVar34 & 1);
      auVar39._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.x;
      bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
      auVar39._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.y;
      bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
      auVar39._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.z;
      bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
      auVar39._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * aVar2.field_3.a;
      auVar38 = vrcp14ps_avx512vl(auVar39);
      auVar40._8_4_ = 0x3f800000;
      auVar40._0_8_ = &DAT_3f8000003f800000;
      auVar40._12_4_ = 0x3f800000;
      auVar40 = vfnmadd213ps_avx512vl(auVar39,auVar38,auVar40);
      auVar39 = vfmadd132ps_fma(auVar40,auVar38,auVar38);
      auVar42 = vbroadcastss_avx512vl(auVar39);
      auVar86 = ZEXT3264(auVar42);
      auVar38 = vmovshdup_avx(auVar39);
      auVar42 = vbroadcastsd_avx512vl(auVar38);
      auVar87 = ZEXT3264(auVar42);
      auVar40 = vshufpd_avx(auVar39,auVar39,1);
      auVar71._8_4_ = 2;
      auVar71._0_8_ = 0x200000002;
      auVar71._12_4_ = 2;
      auVar71._16_4_ = 2;
      auVar71._20_4_ = 2;
      auVar71._24_4_ = 2;
      auVar71._28_4_ = 2;
      auVar42 = vpermps_avx512vl(auVar71,ZEXT1632(auVar39));
      auVar88 = ZEXT3264(auVar42);
      fVar57 = auVar39._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar54._4_4_ = fVar57;
      auVar54._0_4_ = fVar57;
      auVar54._8_4_ = fVar57;
      auVar54._12_4_ = fVar57;
      auVar54._16_4_ = fVar57;
      auVar54._20_4_ = fVar57;
      auVar54._24_4_ = fVar57;
      auVar54._28_4_ = fVar57;
      auVar42 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar89 = ZEXT3264(auVar42);
      auVar44 = ZEXT1632(CONCAT412(auVar39._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar39._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar39._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar57))));
      auVar43 = vpermps_avx512vl(auVar42,auVar44);
      auVar76 = ZEXT3264(auVar43);
      auVar42 = vpermps_avx2(auVar71,auVar44);
      local_26f0 = (ulong)(auVar39._0_4_ < 0.0) << 5;
      local_26f8 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
      local_2700 = (ulong)(auVar40._0_4_ < 0.0) << 5 | 0x80;
      uVar35 = local_2700 ^ 0x20;
      uVar63 = auVar11._0_4_;
      auVar61 = ZEXT3264(CONCAT428(uVar63,CONCAT424(uVar63,CONCAT420(uVar63,CONCAT416(uVar63,
                                                  CONCAT412(uVar63,CONCAT48(uVar63,CONCAT44(uVar63,
                                                  uVar63))))))));
      auVar45._8_4_ = 0x80000000;
      auVar45._0_8_ = 0x8000000080000000;
      auVar45._12_4_ = 0x80000000;
      auVar45._16_4_ = 0x80000000;
      auVar45._20_4_ = 0x80000000;
      auVar45._24_4_ = 0x80000000;
      auVar45._28_4_ = 0x80000000;
      auVar44 = vxorps_avx512vl(auVar54,auVar45);
      auVar90 = ZEXT3264(auVar44);
      auVar43 = vxorps_avx512vl(auVar43,auVar45);
      auVar91 = ZEXT3264(auVar43);
      auVar42 = vxorps_avx512vl(auVar42,auVar45);
      auVar92 = ZEXT3264(auVar42);
      auVar42 = vbroadcastss_avx512vl(auVar41);
      auVar93 = ZEXT3264(auVar42);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar94 = ZEXT3264(auVar42);
      auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar95 = ZEXT3264(auVar42);
      auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar96 = ZEXT1664(auVar41);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar97 = ZEXT3264(auVar42);
      auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
      auVar98 = ZEXT3264(auVar42);
      local_26d0 = local_26f0 ^ 0x20;
      local_26d8 = local_26f8 ^ 0x20;
      uVar34 = local_26f0 ^ 0x20;
      local_26e0 = context;
      uVar32 = local_26f8 ^ 0x20;
      do {
        do {
          do {
            if (local_26e8 == &local_23a0) {
              return;
            }
            pfVar5 = (float *)(local_26e8 + -1);
            local_26e8 = local_26e8 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar5);
          uVar37 = *local_26e8;
          do {
            if ((uVar37 & 8) == 0) {
              auVar42 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + local_26f0),auVar90._0_32_
                                   ,auVar86._0_32_);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + local_26f8),auVar91._0_32_
                                   ,auVar87._0_32_);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + local_2700),auVar92._0_32_
                                   ,auVar88._0_32_);
              auVar43 = vpmaxsd_avx512vl(auVar43,auVar93._0_32_);
              auVar42 = vpmaxsd_avx2(auVar42,auVar43);
              auVar76 = ZEXT3264(auVar42);
              auVar43 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar34),auVar90._0_32_,
                                   auVar86._0_32_);
              auVar44 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar32),auVar91._0_32_,
                                   auVar87._0_32_);
              auVar43 = vpminsd_avx2(auVar43,auVar44);
              auVar44 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar37 + 0x40 + uVar35),auVar92._0_32_,
                                   auVar88._0_32_);
              auVar44 = vpminsd_avx2(auVar44,auVar61._0_32_);
              auVar43 = vpminsd_avx2(auVar43,auVar44);
              uVar20 = vpcmpd_avx512vl(auVar42,auVar43,2);
              unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),(uint)(byte)uVar20);
            }
            if ((uVar37 & 8) == 0) {
              if (unaff_RBX == 0) {
                iVar30 = 4;
              }
              else {
                auVar42 = *(undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0);
                auVar43 = ((undefined1 (*) [32])(uVar37 & 0xfffffffffffffff0))[1];
                auVar44 = vmovdqa64_avx512vl(auVar94._0_32_);
                auVar71 = auVar76._0_32_;
                auVar44 = vpternlogd_avx512vl(auVar44,auVar71,auVar95._0_32_,0xf8);
                uVar37 = unaff_RBX & 0xffffffff;
                auVar45 = vpcompressd_avx512vl(auVar44);
                bVar10 = (bool)((byte)uVar37 & 1);
                auVar49._0_4_ = (uint)bVar10 * auVar45._0_4_ | (uint)!bVar10 * auVar44._0_4_;
                bVar10 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar49._4_4_ = (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * auVar44._4_4_;
                bVar10 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar49._8_4_ = (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * auVar44._8_4_;
                bVar10 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar49._12_4_ = (uint)bVar10 * auVar45._12_4_ | (uint)!bVar10 * auVar44._12_4_;
                bVar10 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar49._16_4_ = (uint)bVar10 * auVar45._16_4_ | (uint)!bVar10 * auVar44._16_4_;
                bVar10 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar49._20_4_ = (uint)bVar10 * auVar45._20_4_ | (uint)!bVar10 * auVar44._20_4_;
                bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar49._24_4_ = (uint)bVar10 * auVar45._24_4_ | (uint)!bVar10 * auVar44._24_4_;
                bVar10 = (bool)((byte)(uVar37 >> 7) & 1);
                auVar49._28_4_ = (uint)bVar10 * auVar45._28_4_ | (uint)!bVar10 * auVar44._28_4_;
                auVar44 = vpermt2q_avx512vl(auVar42,auVar49,auVar43);
                uVar37 = auVar44._0_8_;
                iVar29 = 0;
                uVar33 = unaff_RBX - 1 & unaff_RBX;
                iVar30 = 0;
                if (uVar33 != 0) {
                  auVar44 = vpshufd_avx2(auVar49,0x55);
                  vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                  auVar45 = vpminsd_avx2(auVar49,auVar44);
                  auVar44 = vpmaxsd_avx2(auVar49,auVar44);
                  uVar33 = uVar33 - 1 & uVar33;
                  iVar30 = iVar29;
                  if (uVar33 == 0) {
                    auVar45 = vpermi2q_avx512vl(auVar45,auVar42,auVar43);
                    uVar37 = auVar45._0_8_;
                    auVar42 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                    *local_26e8 = auVar42._0_8_;
                    auVar42 = vpermd_avx2(auVar44,auVar71);
                    *(int *)(local_26e8 + 1) = auVar42._0_4_;
                    local_26e8 = local_26e8 + 2;
                  }
                  else {
                    auVar48 = vpshufd_avx2(auVar49,0xaa);
                    vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                    auVar54 = vpminsd_avx2(auVar45,auVar48);
                    auVar45 = vpmaxsd_avx2(auVar45,auVar48);
                    auVar48 = vpminsd_avx2(auVar44,auVar45);
                    auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                    uVar33 = uVar33 - 1 & uVar33;
                    if (uVar33 == 0) {
                      auVar45 = vpermi2q_avx512vl(auVar54,auVar42,auVar43);
                      uVar37 = auVar45._0_8_;
                      auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                      *local_26e8 = auVar45._0_8_;
                      auVar44 = vpermd_avx2(auVar44,auVar71);
                      *(int *)(local_26e8 + 1) = auVar44._0_4_;
                      auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                      local_26e8[2] = auVar42._0_8_;
                      auVar42 = vpermd_avx2(auVar48,auVar71);
                      *(int *)(local_26e8 + 3) = auVar42._0_4_;
                      local_26e8 = local_26e8 + 4;
                    }
                    else {
                      auVar45 = vpshufd_avx2(auVar49,0xff);
                      vpermt2q_avx512vl(auVar42,auVar45,auVar43);
                      auVar51 = vpminsd_avx2(auVar54,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar54,auVar45);
                      auVar54 = vpminsd_avx2(auVar48,auVar45);
                      auVar45 = vpmaxsd_avx2(auVar48,auVar45);
                      auVar48 = vpminsd_avx2(auVar44,auVar45);
                      auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                      uVar33 = uVar33 - 1 & uVar33;
                      if (uVar33 == 0) {
                        auVar45 = vpermi2q_avx512vl(auVar51,auVar42,auVar43);
                        uVar37 = auVar45._0_8_;
                        auVar45 = vpermt2q_avx512vl(auVar42,auVar44,auVar43);
                        *local_26e8 = auVar45._0_8_;
                        auVar76 = ZEXT3264(auVar71);
                        auVar44 = vpermd_avx2(auVar44,auVar71);
                        *(int *)(local_26e8 + 1) = auVar44._0_4_;
                        auVar44 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                        local_26e8[2] = auVar44._0_8_;
                        auVar44 = vpermd_avx2(auVar48,auVar71);
                        *(int *)(local_26e8 + 3) = auVar44._0_4_;
                        auVar42 = vpermt2q_avx512vl(auVar42,auVar54,auVar43);
                        local_26e8[4] = auVar42._0_8_;
                        auVar42 = vpermd_avx2(auVar54,auVar71);
                        *(int *)(local_26e8 + 5) = auVar42._0_4_;
                        local_26e8 = local_26e8 + 6;
                      }
                      else {
                        auVar49 = valignd_avx512vl(auVar49,auVar49,3);
                        auVar45 = vmovdqa64_avx512vl(auVar96._0_32_);
                        auVar45 = vpermt2d_avx512vl(auVar45,auVar97._0_32_,auVar51);
                        auVar45 = vpermt2d_avx512vl(auVar45,auVar98._0_32_,auVar54);
                        auVar54 = vpermt2d_avx512vl(auVar45,auVar98._0_32_,auVar48);
                        auVar45 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar44 = vpermt2d_avx512vl(auVar54,auVar45,auVar44);
                        auVar76 = ZEXT3264(auVar44);
                        uVar37 = uVar33;
                        do {
                          auVar45 = auVar76._0_32_;
                          auVar44 = vpermps_avx512vl(auVar89._0_32_,auVar49);
                          auVar49 = valignd_avx512vl(auVar49,auVar49,1);
                          vpermt2q_avx512vl(auVar42,auVar49,auVar43);
                          uVar37 = uVar37 - 1 & uVar37;
                          uVar20 = vpcmpd_avx512vl(auVar44,auVar45,5);
                          auVar44 = vpmaxsd_avx2(auVar44,auVar45);
                          bVar28 = (byte)uVar20 << 1;
                          auVar45 = valignd_avx512vl(auVar45,auVar45,7);
                          bVar10 = (bool)((byte)uVar20 & 1);
                          auVar48._4_4_ =
                               (uint)bVar10 * auVar45._4_4_ | (uint)!bVar10 * auVar44._4_4_;
                          auVar48._0_4_ = auVar44._0_4_;
                          bVar10 = (bool)(bVar28 >> 2 & 1);
                          auVar48._8_4_ =
                               (uint)bVar10 * auVar45._8_4_ | (uint)!bVar10 * auVar44._8_4_;
                          bVar10 = (bool)(bVar28 >> 3 & 1);
                          auVar48._12_4_ =
                               (uint)bVar10 * auVar45._12_4_ | (uint)!bVar10 * auVar44._12_4_;
                          bVar10 = (bool)(bVar28 >> 4 & 1);
                          auVar48._16_4_ =
                               (uint)bVar10 * auVar45._16_4_ | (uint)!bVar10 * auVar44._16_4_;
                          bVar10 = (bool)(bVar28 >> 5 & 1);
                          auVar48._20_4_ =
                               (uint)bVar10 * auVar45._20_4_ | (uint)!bVar10 * auVar44._20_4_;
                          bVar10 = (bool)(bVar28 >> 6 & 1);
                          auVar48._24_4_ =
                               (uint)bVar10 * auVar45._24_4_ | (uint)!bVar10 * auVar44._24_4_;
                          auVar48._28_4_ =
                               (uint)(bVar28 >> 7) * auVar45._28_4_ |
                               (uint)!(bool)(bVar28 >> 7) * auVar44._28_4_;
                          auVar76 = ZEXT3264(auVar48);
                        } while (uVar37 != 0);
                        lVar36 = POPCOUNT(uVar33) + 3;
                        do {
                          auVar44 = vpermi2q_avx512vl(auVar48,auVar42,auVar43);
                          *local_26e8 = auVar44._0_8_;
                          auVar45 = auVar76._0_32_;
                          auVar44 = vpermd_avx2(auVar45,auVar71);
                          *(int *)(local_26e8 + 1) = auVar44._0_4_;
                          auVar48 = valignd_avx512vl(auVar45,auVar45,1);
                          local_26e8 = local_26e8 + 2;
                          auVar76 = ZEXT3264(auVar48);
                          lVar36 = lVar36 + -1;
                        } while (lVar36 != 0);
                        auVar42 = vpermt2q_avx512vl(auVar42,auVar48,auVar43);
                        uVar37 = auVar42._0_8_;
                        auVar76 = ZEXT3264(auVar71);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar30 = 6;
            }
          } while (iVar30 == 0);
        } while (iVar30 != 6);
        local_23e0 = auVar76._0_32_;
        local_26c8 = (ulong)((uint)uVar37 & 0xf) - 8;
        if (local_26c8 != 0) {
          uVar37 = uVar37 & 0xfffffffffffffff0;
          lVar36 = 0;
          do {
            lVar31 = lVar36 * 0x60;
            pSVar3 = local_26e0->scene;
            ppfVar4 = (pSVar3->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar37 + 0x48 + lVar31)];
            auVar62._16_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 0x28 + lVar31));
            auVar62._0_16_ = *(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar37 + 8 + lVar31));
            pfVar6 = ppfVar4[*(uint *)(uVar37 + 0x40 + lVar31)];
            auVar65._16_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + 0x20 + lVar31));
            auVar65._0_16_ = *(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar37 + lVar31));
            pfVar7 = ppfVar4[*(uint *)(uVar37 + 0x4c + lVar31)];
            auVar72._16_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0x2c + lVar31));
            auVar72._0_16_ = *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar37 + 0xc + lVar31));
            pfVar8 = ppfVar4[*(uint *)(uVar37 + 0x44 + lVar31)];
            auVar78._16_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 0x24 + lVar31));
            auVar78._0_16_ = *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar37 + 4 + lVar31));
            lVar1 = uVar37 + 0x40 + lVar31;
            local_23c0 = *(undefined8 *)(lVar1 + 0x10);
            uStack_23b8 = *(undefined8 *)(lVar1 + 0x18);
            uStack_23b0 = local_23c0;
            uStack_23a8 = uStack_23b8;
            lVar1 = uVar37 + 0x50 + lVar31;
            local_2660 = *(undefined8 *)(lVar1 + 0x10);
            uStack_2658 = *(undefined8 *)(lVar1 + 0x18);
            auVar38 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x10 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x18 + lVar31)));
            auVar41 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x10 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x18 + lVar31)));
            auVar40 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x14 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x1c + lVar31)));
            auVar11 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x14 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x1c + lVar31)));
            auVar39 = vunpcklps_avx(auVar41,auVar11);
            auVar69 = vunpcklps_avx(auVar38,auVar40);
            auVar41 = vunpckhps_avx(auVar38,auVar40);
            auVar40 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x30 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x38 + lVar31)));
            auVar11 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar37 + 0x30 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar37 + 0x38 + lVar31)));
            auVar15 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x34 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x3c + lVar31)));
            auVar38 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar37 + 0x34 + lVar31)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar37 + 0x3c + lVar31)));
            auVar38 = vunpcklps_avx(auVar11,auVar38);
            auVar16 = vunpcklps_avx(auVar40,auVar15);
            auVar11 = vunpckhps_avx(auVar40,auVar15);
            uStack_2650 = local_2660;
            uStack_2648 = uStack_2658;
            auVar42 = vunpcklps_avx(auVar78,auVar72);
            auVar43 = vunpcklps_avx(auVar65,auVar62);
            auVar48 = vunpcklps_avx(auVar43,auVar42);
            auVar49 = vunpckhps_avx(auVar43,auVar42);
            auVar42 = vunpckhps_avx(auVar78,auVar72);
            auVar43 = vunpckhps_avx(auVar65,auVar62);
            auVar51 = vunpcklps_avx(auVar43,auVar42);
            auVar42._16_16_ = auVar69;
            auVar42._0_16_ = auVar69;
            auVar43._16_16_ = auVar41;
            auVar43._0_16_ = auVar41;
            auVar44._16_16_ = auVar39;
            auVar44._0_16_ = auVar39;
            auVar73._16_16_ = auVar16;
            auVar73._0_16_ = auVar16;
            auVar70._16_16_ = auVar11;
            auVar70._0_16_ = auVar11;
            auVar58._16_16_ = auVar38;
            auVar58._0_16_ = auVar38;
            auVar42 = vsubps_avx(auVar48,auVar42);
            auVar43 = vsubps_avx(auVar49,auVar43);
            auVar44 = vsubps_avx(auVar51,auVar44);
            auVar45 = vsubps_avx(auVar73,auVar48);
            auVar71 = vsubps_avx(auVar70,auVar49);
            auVar54 = vsubps_avx(auVar58,auVar51);
            auVar47._4_4_ = auVar43._4_4_ * auVar54._4_4_;
            auVar47._0_4_ = auVar43._0_4_ * auVar54._0_4_;
            auVar47._8_4_ = auVar43._8_4_ * auVar54._8_4_;
            auVar47._12_4_ = auVar43._12_4_ * auVar54._12_4_;
            auVar47._16_4_ = auVar43._16_4_ * auVar54._16_4_;
            auVar47._20_4_ = auVar43._20_4_ * auVar54._20_4_;
            auVar47._24_4_ = auVar43._24_4_ * auVar54._24_4_;
            auVar47._28_4_ = auVar38._12_4_;
            auVar11 = vfmsub231ps_fma(auVar47,auVar71,auVar44);
            auVar25._4_4_ = auVar44._4_4_ * auVar45._4_4_;
            auVar25._0_4_ = auVar44._0_4_ * auVar45._0_4_;
            auVar25._8_4_ = auVar44._8_4_ * auVar45._8_4_;
            auVar25._12_4_ = auVar44._12_4_ * auVar45._12_4_;
            auVar25._16_4_ = auVar44._16_4_ * auVar45._16_4_;
            auVar25._20_4_ = auVar44._20_4_ * auVar45._20_4_;
            auVar25._24_4_ = auVar44._24_4_ * auVar45._24_4_;
            auVar25._28_4_ = auVar39._12_4_;
            auVar38 = vfmsub231ps_fma(auVar25,auVar54,auVar42);
            auVar26._4_4_ = auVar42._4_4_ * auVar71._4_4_;
            auVar26._0_4_ = auVar42._0_4_ * auVar71._0_4_;
            auVar26._8_4_ = auVar42._8_4_ * auVar71._8_4_;
            auVar26._12_4_ = auVar42._12_4_ * auVar71._12_4_;
            auVar26._16_4_ = auVar42._16_4_ * auVar71._16_4_;
            auVar26._20_4_ = auVar42._20_4_ * auVar71._20_4_;
            auVar26._24_4_ = auVar42._24_4_ * auVar71._24_4_;
            auVar26._28_4_ = auVar69._12_4_;
            uVar63 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar85._4_4_ = uVar63;
            auVar85._0_4_ = uVar63;
            auVar85._8_4_ = uVar63;
            auVar85._12_4_ = uVar63;
            auVar85._16_4_ = uVar63;
            auVar85._20_4_ = uVar63;
            auVar85._24_4_ = uVar63;
            auVar85._28_4_ = uVar63;
            auVar46 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar47 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar63 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar50._4_4_ = uVar63;
            auVar50._0_4_ = uVar63;
            auVar50._8_4_ = uVar63;
            auVar50._12_4_ = uVar63;
            auVar50._16_4_ = uVar63;
            auVar50._20_4_ = uVar63;
            auVar50._24_4_ = uVar63;
            auVar50._28_4_ = uVar63;
            auVar48 = vsubps_avx512vl(auVar48,auVar50);
            auVar40 = vfmsub231ps_fma(auVar26,auVar45,auVar43);
            uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar52._4_4_ = uVar63;
            auVar52._0_4_ = uVar63;
            auVar52._8_4_ = uVar63;
            auVar52._12_4_ = uVar63;
            auVar52._16_4_ = uVar63;
            auVar52._20_4_ = uVar63;
            auVar52._24_4_ = uVar63;
            auVar52._28_4_ = uVar63;
            auVar49 = vsubps_avx512vl(auVar49,auVar52);
            uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar53._4_4_ = uVar63;
            auVar53._0_4_ = uVar63;
            auVar53._8_4_ = uVar63;
            auVar53._12_4_ = uVar63;
            auVar53._16_4_ = uVar63;
            auVar53._20_4_ = uVar63;
            auVar53._24_4_ = uVar63;
            auVar53._28_4_ = uVar63;
            auVar50 = vsubps_avx512vl(auVar51,auVar53);
            auVar51 = vmulps_avx512vl(auVar46,auVar50);
            auVar52 = vfmsub231ps_avx512vl(auVar51,auVar49,auVar47);
            auVar51 = vmulps_avx512vl(auVar47,auVar48);
            auVar39 = vfmsub231ps_fma(auVar51,auVar50,auVar85);
            auVar51 = vmulps_avx512vl(auVar85,auVar49);
            auVar53 = vfmsub231ps_avx512vl(auVar51,auVar48,auVar46);
            auVar51 = vmulps_avx512vl(ZEXT1632(auVar40),auVar47);
            auVar51 = vfmadd231ps_avx512vl(auVar51,ZEXT1632(auVar38),auVar46);
            local_25e0 = vfmadd231ps_avx512vl(auVar51,ZEXT1632(auVar11),auVar85);
            auVar51._8_4_ = 0x7fffffff;
            auVar51._0_8_ = 0x7fffffff7fffffff;
            auVar51._12_4_ = 0x7fffffff;
            auVar51._16_4_ = 0x7fffffff;
            auVar51._20_4_ = 0x7fffffff;
            auVar51._24_4_ = 0x7fffffff;
            auVar51._28_4_ = 0x7fffffff;
            vandps_avx512vl(local_25e0,auVar51);
            auVar54 = vmulps_avx512vl(auVar54,auVar53);
            auVar41 = vfmadd231ps_fma(auVar54,ZEXT1632(auVar39),auVar71);
            auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar52,auVar45);
            auVar46._8_4_ = 0x80000000;
            auVar46._0_8_ = 0x8000000080000000;
            auVar46._12_4_ = 0x80000000;
            auVar46._16_4_ = 0x80000000;
            auVar46._20_4_ = 0x80000000;
            auVar46._24_4_ = 0x80000000;
            auVar46._28_4_ = 0x80000000;
            auVar45 = vandpd_avx512vl(local_25e0,auVar46);
            uVar77 = auVar45._0_4_;
            auVar74._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
            uVar79 = auVar45._4_4_;
            auVar74._4_4_ = (float)(uVar79 ^ auVar41._4_4_);
            uVar80 = auVar45._8_4_;
            auVar74._8_4_ = (float)(uVar80 ^ auVar41._8_4_);
            uVar81 = auVar45._12_4_;
            auVar74._12_4_ = (float)(uVar81 ^ auVar41._12_4_);
            fVar57 = auVar45._16_4_;
            auVar74._16_4_ = fVar57;
            fVar82 = auVar45._20_4_;
            auVar74._20_4_ = fVar82;
            fVar83 = auVar45._24_4_;
            auVar74._24_4_ = fVar83;
            fVar64 = auVar45._28_4_;
            auVar74._28_4_ = fVar64;
            auVar44 = vmulps_avx512vl(auVar44,auVar53);
            auVar41 = vfmadd231ps_fma(auVar44,auVar43,ZEXT1632(auVar39));
            auVar41 = vfmadd231ps_fma(ZEXT1632(auVar41),auVar42,auVar52);
            auVar75._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
            auVar75._4_4_ = (float)(uVar79 ^ auVar41._4_4_);
            auVar75._8_4_ = (float)(uVar80 ^ auVar41._8_4_);
            auVar75._12_4_ = (float)(uVar81 ^ auVar41._12_4_);
            auVar75._16_4_ = fVar57;
            auVar75._20_4_ = fVar82;
            auVar75._24_4_ = fVar83;
            auVar75._28_4_ = fVar64;
            uVar20 = vcmpps_avx512vl(auVar74,ZEXT832(0) << 0x20,5);
            uVar17 = vcmpps_avx512vl(auVar75,ZEXT832(0) << 0x20,5);
            uVar18 = vcmpps_avx512vl(local_25e0,ZEXT832(0) << 0x20,4);
            auVar84._0_4_ = auVar75._0_4_ + auVar74._0_4_;
            auVar84._4_4_ = auVar75._4_4_ + auVar74._4_4_;
            auVar84._8_4_ = auVar75._8_4_ + auVar74._8_4_;
            auVar84._12_4_ = auVar75._12_4_ + auVar74._12_4_;
            auVar84._16_4_ = fVar57 + fVar57;
            auVar84._20_4_ = fVar82 + fVar82;
            auVar84._24_4_ = fVar83 + fVar83;
            auVar84._28_4_ = fVar64 + fVar64;
            uVar19 = vcmpps_avx512vl(auVar84,local_25e0,2);
            local_25bf = (byte)uVar20 & (byte)uVar17 & (byte)uVar18 & (byte)uVar19;
            if (local_25bf != 0) {
              auVar27._4_4_ = auVar40._4_4_ * auVar50._4_4_;
              auVar27._0_4_ = auVar40._0_4_ * auVar50._0_4_;
              auVar27._8_4_ = auVar40._8_4_ * auVar50._8_4_;
              auVar27._12_4_ = auVar40._12_4_ * auVar50._12_4_;
              auVar27._16_4_ = auVar50._16_4_ * 0.0;
              auVar27._20_4_ = auVar50._20_4_ * 0.0;
              auVar27._24_4_ = auVar50._24_4_ * 0.0;
              auVar27._28_4_ = auVar50._28_4_;
              auVar41 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar38),auVar27);
              auVar41 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar11),ZEXT1632(auVar41));
              local_2600._0_4_ = (float)(uVar77 ^ auVar41._0_4_);
              local_2600._4_4_ = (float)(uVar79 ^ auVar41._4_4_);
              local_2600._8_4_ = (float)(uVar80 ^ auVar41._8_4_);
              local_2600._12_4_ = (float)(uVar81 ^ auVar41._12_4_);
              local_2600._16_4_ = fVar57;
              local_2600._20_4_ = fVar82;
              local_2600._24_4_ = fVar83;
              local_2600._28_4_ = fVar64;
              uVar63 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar21._4_4_ = uVar63;
              auVar21._0_4_ = uVar63;
              auVar21._8_4_ = uVar63;
              auVar21._12_4_ = uVar63;
              auVar21._16_4_ = uVar63;
              auVar21._20_4_ = uVar63;
              auVar21._24_4_ = uVar63;
              auVar21._28_4_ = uVar63;
              auVar42 = vmulps_avx512vl(local_25e0,auVar21);
              uVar20 = vcmpps_avx512vl(auVar42,local_2600,1);
              fVar64 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar64;
              auVar22._0_4_ = fVar64;
              auVar22._8_4_ = fVar64;
              auVar22._12_4_ = fVar64;
              auVar22._16_4_ = fVar64;
              auVar22._20_4_ = fVar64;
              auVar22._24_4_ = fVar64;
              auVar22._28_4_ = fVar64;
              auVar42 = vmulps_avx512vl(local_25e0,auVar22);
              uVar17 = vcmpps_avx512vl(local_2600,auVar42,2);
              local_25bf = (byte)uVar20 & (byte)uVar17 & local_25bf;
              if (local_25bf != 0) {
                auVar42 = vsubps_avx(local_25e0,auVar75);
                local_2640 = vblendps_avx(auVar74,auVar42,0xf0);
                auVar42 = vsubps_avx(local_25e0,auVar74);
                local_2620 = vblendps_avx(auVar75,auVar42,0xf0);
                fVar64 = (float)DAT_02060940;
                local_2540._0_4_ = auVar11._0_4_ * fVar64;
                fVar66 = DAT_02060940._4_4_;
                local_2540._4_4_ = auVar11._4_4_ * fVar66;
                fVar67 = DAT_02060940._8_4_;
                local_2540._8_4_ = auVar11._8_4_ * fVar67;
                fVar68 = DAT_02060940._12_4_;
                local_2540._12_4_ = auVar11._12_4_ * fVar68;
                fVar12 = DAT_02060940._16_4_;
                local_2540._16_4_ = fVar12 * 0.0;
                fVar13 = DAT_02060940._20_4_;
                local_2540._20_4_ = fVar13 * 0.0;
                fVar14 = DAT_02060940._24_4_;
                local_2540._24_4_ = fVar14 * 0.0;
                local_2540._28_4_ = 0;
                local_2520._4_4_ = auVar38._4_4_ * fVar66;
                local_2520._0_4_ = auVar38._0_4_ * fVar64;
                local_2520._8_4_ = auVar38._8_4_ * fVar67;
                local_2520._12_4_ = auVar38._12_4_ * fVar68;
                local_2520._16_4_ = fVar12 * 0.0;
                local_2520._20_4_ = fVar13 * 0.0;
                local_2520._24_4_ = fVar14 * 0.0;
                local_2520._28_4_ = 0;
                local_2500._4_4_ = auVar40._4_4_ * fVar66;
                local_2500._0_4_ = auVar40._0_4_ * fVar64;
                local_2500._8_4_ = auVar40._8_4_ * fVar67;
                local_2500._12_4_ = auVar40._12_4_ * fVar68;
                local_2500._16_4_ = fVar12 * 0.0;
                local_2500._20_4_ = fVar13 * 0.0;
                local_2500._24_4_ = fVar14 * 0.0;
                local_2500._28_4_ = 0;
                uVar34 = (ulong)local_25bf;
                auVar42 = vrcp14ps_avx512vl(local_25e0);
                auVar23._8_4_ = 0x3f800000;
                auVar23._0_8_ = &DAT_3f8000003f800000;
                auVar23._12_4_ = 0x3f800000;
                auVar23._16_4_ = 0x3f800000;
                auVar23._20_4_ = 0x3f800000;
                auVar23._24_4_ = 0x3f800000;
                auVar23._28_4_ = 0x3f800000;
                auVar43 = vfnmadd213ps_avx512vl(local_25e0,auVar42,auVar23);
                auVar41 = vfmadd132ps_fma(auVar43,auVar42,auVar42);
                fVar64 = auVar41._0_4_;
                fVar66 = auVar41._4_4_;
                local_2560._4_4_ = fVar66 * local_2600._4_4_;
                local_2560._0_4_ = fVar64 * local_2600._0_4_;
                fVar67 = auVar41._8_4_;
                local_2560._8_4_ = fVar67 * local_2600._8_4_;
                fVar68 = auVar41._12_4_;
                local_2560._12_4_ = fVar68 * local_2600._12_4_;
                local_2560._16_4_ = fVar57 * 0.0;
                local_2560._20_4_ = fVar82 * 0.0;
                local_2560._24_4_ = fVar83 * 0.0;
                local_2560._28_4_ = DAT_02060940._28_4_;
                auVar61 = ZEXT3264(local_2560);
                local_25a0[0] = local_2640._0_4_ * fVar64;
                local_25a0[1] = local_2640._4_4_ * fVar66;
                local_25a0[2] = local_2640._8_4_ * fVar67;
                local_25a0[3] = local_2640._12_4_ * fVar68;
                fStack_2590 = local_2640._16_4_ * 0.0;
                fStack_258c = local_2640._20_4_ * 0.0;
                fStack_2588 = local_2640._24_4_ * 0.0;
                uStack_2584 = auVar42._28_4_;
                local_2580[0] = local_2620._0_4_ * fVar64;
                local_2580[1] = local_2620._4_4_ * fVar66;
                local_2580[2] = local_2620._8_4_ * fVar67;
                local_2580[3] = local_2620._12_4_ * fVar68;
                fStack_2570 = local_2620._16_4_ * 0.0;
                fStack_256c = local_2620._20_4_ * 0.0;
                fStack_2568 = local_2620._24_4_ * 0.0;
                uStack_2564 = auVar42._28_4_;
                auVar59._8_4_ = 0x7f800000;
                auVar59._0_8_ = 0x7f8000007f800000;
                auVar59._12_4_ = 0x7f800000;
                auVar59._16_4_ = 0x7f800000;
                auVar59._20_4_ = 0x7f800000;
                auVar59._24_4_ = 0x7f800000;
                auVar59._28_4_ = 0x7f800000;
                auVar42 = vblendmps_avx512vl(auVar59,local_2560);
                auVar55._0_4_ =
                     (uint)(local_25bf & 1) * auVar42._0_4_ |
                     (uint)!(bool)(local_25bf & 1) * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 1 & 1);
                auVar55._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 2 & 1);
                auVar55._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 3 & 1);
                auVar55._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 4 & 1);
                auVar55._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 5 & 1);
                auVar55._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_25bf >> 6 & 1);
                auVar55._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * 0x7f800000;
                auVar55._28_4_ =
                     (uint)(local_25bf >> 7) * auVar42._28_4_ |
                     (uint)!(bool)(local_25bf >> 7) * 0x7f800000;
                auVar42 = vshufps_avx(auVar55,auVar55,0xb1);
                auVar42 = vminps_avx(auVar55,auVar42);
                auVar43 = vshufpd_avx(auVar42,auVar42,5);
                auVar42 = vminps_avx(auVar42,auVar43);
                auVar43 = vpermpd_avx2(auVar42,0x4e);
                auVar42 = vminps_avx(auVar42,auVar43);
                uVar20 = vcmpps_avx512vl(auVar55,auVar42,0);
                bVar28 = (byte)uVar20 & local_25bf;
                if (bVar28 == 0) {
                  bVar28 = local_25bf;
                }
                local_2708 = 0;
                for (uVar32 = (ulong)bVar28; (uVar32 & 1) == 0;
                    uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                  local_2708 = local_2708 + 1;
                }
                do {
                  local_2678 = *(uint *)((long)&local_23c0 + local_2708 * 4);
                  local_2718 = (ulong)local_2678;
                  local_2710 = (pSVar3->geometries).items[local_2678].ptr;
                  if ((local_2710->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar34 = (ulong)(byte)(~(byte)(1 << ((uint)local_2708 & 0x1f)) & (byte)uVar34);
                    bVar10 = true;
                  }
                  else if ((local_26e0->args->filter == (RTCFilterFunctionN)0x0) &&
                          (local_2710->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar10 = false;
                  }
                  else {
                    local_2720 = local_26e0->args;
                    local_24e0 = auVar61._0_32_;
                    local_24c0 = auVar93._0_32_;
                    local_24a0 = auVar92._0_32_;
                    local_2480 = auVar91._0_32_;
                    local_2460 = auVar90._0_32_;
                    local_2440 = auVar88._0_32_;
                    local_2420 = auVar87._0_32_;
                    local_2400 = auVar86._0_32_;
                    local_26c0.context = local_26e0->user;
                    local_2690 = *(float *)(local_2540 + local_2708 * 4);
                    local_268c = *(undefined4 *)(local_2520 + local_2708 * 4);
                    local_2688 = *(undefined4 *)(local_2500 + local_2708 * 4);
                    local_2684 = local_25a0[local_2708];
                    local_2680 = local_2580[local_2708];
                    local_267c = *(undefined4 *)((long)&local_2660 + local_2708 * 4);
                    local_2674 = (local_26c0.context)->instID[0];
                    local_2670 = (local_26c0.context)->instPrimID[0];
                    fVar57 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + local_2708 * 4);
                    local_2724 = -1;
                    local_26c0.valid = &local_2724;
                    local_26c0.geometryUserPtr = local_2710->userPtr;
                    local_26c0.ray = (RTCRayN *)ray;
                    local_26c0.hit = (RTCHitN *)&local_2690;
                    local_26c0.N = 1;
                    if ((local_2710->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_2710->intersectionFilterN)(&local_26c0), *local_26c0.valid != 0)) {
                      if (local_2720->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_2720->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_2710->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_2720->filter)(&local_26c0);
                        }
                        if (*local_26c0.valid == 0) goto LAB_01fc8201;
                      }
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_26c0.hit;
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_26c0.hit + 4);
                      (((Vec3f *)((long)local_26c0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_26c0.hit + 8);
                      *(float *)((long)local_26c0.ray + 0x3c) = *(float *)(local_26c0.hit + 0xc);
                      *(float *)((long)local_26c0.ray + 0x40) = *(float *)(local_26c0.hit + 0x10);
                      *(float *)((long)local_26c0.ray + 0x44) = *(float *)(local_26c0.hit + 0x14);
                      *(float *)((long)local_26c0.ray + 0x48) = *(float *)(local_26c0.hit + 0x18);
                      *(float *)((long)local_26c0.ray + 0x4c) = *(float *)(local_26c0.hit + 0x1c);
                      *(float *)((long)local_26c0.ray + 0x50) = *(float *)(local_26c0.hit + 0x20);
                    }
                    else {
LAB_01fc8201:
                      (ray->super_RayK<1>).tfar = fVar57;
                    }
                    auVar61 = ZEXT3264(local_24e0);
                    fVar57 = (ray->super_RayK<1>).tfar;
                    auVar24._4_4_ = fVar57;
                    auVar24._0_4_ = fVar57;
                    auVar24._8_4_ = fVar57;
                    auVar24._12_4_ = fVar57;
                    auVar24._16_4_ = fVar57;
                    auVar24._20_4_ = fVar57;
                    auVar24._24_4_ = fVar57;
                    auVar24._28_4_ = fVar57;
                    uVar20 = vcmpps_avx512vl(local_24e0,auVar24,2);
                    uVar34 = (ulong)((uint)(byte)(~(byte)(1 << ((uint)local_2708 & 0x1f)) &
                                                 (byte)uVar34) & (uint)uVar20);
                    bVar10 = true;
                    auVar86 = ZEXT3264(local_2400);
                    auVar87 = ZEXT3264(local_2420);
                    auVar88 = ZEXT3264(local_2440);
                    auVar42 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar89 = ZEXT3264(auVar42);
                    auVar90 = ZEXT3264(local_2460);
                    auVar91 = ZEXT3264(local_2480);
                    auVar92 = ZEXT3264(local_24a0);
                    auVar93 = ZEXT3264(local_24c0);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar94 = ZEXT3264(auVar42);
                    auVar42 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar95 = ZEXT3264(auVar42);
                    auVar41 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar96 = ZEXT1664(auVar41);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar97 = ZEXT3264(auVar42);
                    auVar42 = vpmovsxbd_avx512vl(ZEXT816(0x5040302010008));
                    auVar98 = ZEXT3264(auVar42);
                  }
                  if (!bVar10) {
                    fVar57 = local_25a0[local_2708];
                    fVar82 = local_2580[local_2708];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2560 + local_2708 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_2540 + local_2708 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_2520 + local_2708 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_2500 + local_2708 * 4);
                    ray->u = fVar57;
                    ray->v = fVar82;
                    ray->primID = *(uint *)((long)&local_2660 + local_2708 * 4);
                    ray->geomID = (uint)local_2718;
                    pRVar9 = local_26e0->user;
                    ray->instID[0] = pRVar9->instID[0];
                    ray->instPrimID[0] = pRVar9->instPrimID[0];
                    break;
                  }
                  bVar28 = (byte)uVar34;
                  if (bVar28 == 0) break;
                  auVar60._8_4_ = 0x7f800000;
                  auVar60._0_8_ = 0x7f8000007f800000;
                  auVar60._12_4_ = 0x7f800000;
                  auVar60._16_4_ = 0x7f800000;
                  auVar60._20_4_ = 0x7f800000;
                  auVar60._24_4_ = 0x7f800000;
                  auVar60._28_4_ = 0x7f800000;
                  auVar42 = vblendmps_avx512vl(auVar60,auVar61._0_32_);
                  auVar56._0_4_ =
                       (uint)(bVar28 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar28 & 1) * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 1) & 1);
                  auVar56._4_4_ = (uint)bVar10 * auVar42._4_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 2) & 1);
                  auVar56._8_4_ = (uint)bVar10 * auVar42._8_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 3) & 1);
                  auVar56._12_4_ = (uint)bVar10 * auVar42._12_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 4) & 1);
                  auVar56._16_4_ = (uint)bVar10 * auVar42._16_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 5) & 1);
                  auVar56._20_4_ = (uint)bVar10 * auVar42._20_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar34 >> 6) & 1);
                  auVar56._24_4_ = (uint)bVar10 * auVar42._24_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = SUB81(uVar34 >> 7,0);
                  auVar56._28_4_ = (uint)bVar10 * auVar42._28_4_ | (uint)!bVar10 * 0x7f800000;
                  auVar42 = vshufps_avx(auVar56,auVar56,0xb1);
                  auVar42 = vminps_avx(auVar56,auVar42);
                  auVar43 = vshufpd_avx(auVar42,auVar42,5);
                  auVar42 = vminps_avx(auVar42,auVar43);
                  auVar43 = vpermpd_avx2(auVar42,0x4e);
                  auVar42 = vminps_avx(auVar42,auVar43);
                  uVar20 = vcmpps_avx512vl(auVar56,auVar42,0);
                  bVar28 = (byte)uVar20 & bVar28;
                  uVar77 = (uint)uVar34;
                  if (bVar28 != 0) {
                    uVar77 = (uint)bVar28;
                  }
                  uVar79 = 0;
                  for (; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x80000000) {
                    uVar79 = uVar79 + 1;
                  }
                  local_2708 = (ulong)uVar79;
                } while( true );
              }
            }
            lVar36 = lVar36 + 1;
          } while (lVar36 != local_26c8);
        }
        fVar57 = (ray->super_RayK<1>).tfar;
        auVar61 = ZEXT3264(CONCAT428(fVar57,CONCAT424(fVar57,CONCAT420(fVar57,CONCAT416(fVar57,
                                                  CONCAT412(fVar57,CONCAT48(fVar57,CONCAT44(fVar57,
                                                  fVar57))))))));
        auVar76 = ZEXT3264(local_23e0);
        uVar34 = local_26d0;
        uVar32 = local_26d8;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }